

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O0

void __thiscall Fl_Button::simulate_key_action(Fl_Button *this)

{
  Fl_Widget_Tracker *this_00;
  Fl_Button *this_local;
  
  if (key_release_tracker != (Fl_Widget_Tracker *)0x0) {
    Fl::remove_timeout(key_release_timeout,key_release_tracker);
    key_release_timeout(key_release_tracker);
  }
  value(this,1);
  Fl_Widget::redraw(&this->super_Fl_Widget);
  this_00 = (Fl_Widget_Tracker *)operator_new(8);
  Fl_Widget_Tracker::Fl_Widget_Tracker(this_00,&this->super_Fl_Widget);
  key_release_tracker = this_00;
  Fl::add_timeout(0.15,key_release_timeout,this_00);
  return;
}

Assistant:

void Fl_Button::simulate_key_action()
{
  if (key_release_tracker) {
    Fl::remove_timeout(key_release_timeout, key_release_tracker);
    key_release_timeout(key_release_tracker);
  }
  value(1);
  redraw();
  key_release_tracker = new Fl_Widget_Tracker(this);
  Fl::add_timeout(0.15, key_release_timeout, key_release_tracker);
}